

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O1

string * CxxModuleMapContent_abi_cxx11_
                   (string *__return_storage_ptr__,CxxModuleMapFormat format,CxxModuleLocations *loc
                   ,cmScanDepInfo *obj,CxxModuleUsage *usages)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
  *this;
  LookupMethod LVar1;
  _Rb_tree_color _Var2;
  pointer pcVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *pmVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
  *pmVar5;
  ostream *poVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  _Base_ptr p_Var10;
  long lVar11;
  cmSourceReqInfo *p;
  pointer pcVar12;
  char *pcVar13;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> bmi_loc
  ;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transitive_usage_names;
  stringstream mm;
  char local_259;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  _Base_ptr local_238;
  size_t local_230;
  string *local_228;
  cmScanDepInfo *local_220;
  CxxModuleUsage *local_218;
  undefined1 local_210 [32];
  char local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_228 = __return_storage_ptr__;
  local_218 = usages;
  if (format == Msvc) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    pcVar12 = (obj->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (obj->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pcVar3 - (long)pcVar12 >> 3) * 0x4ec4ec4ec4ec4ec5) < 2) {
      local_220 = obj;
      if (pcVar12 != pcVar3) {
        do {
          pcVar13 = "-internalPartition\n";
          if (pcVar12->IsInterface != false) {
            pcVar13 = "-interface\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pcVar13,(ulong)(pcVar12->IsInterface ^ 1) * 8 + 0xb);
          CxxModuleLocations::BmiGeneratorPathForModule
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_258,loc,&pcVar12->LogicalName);
          if (local_238._0_1_ == true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"-ifcOutput ",0xb);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_258._0_8_,
                                CONCAT44(local_258._12_4_,local_258._8_4_));
            local_1e8._M_impl._0_1_ =
                 (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  )0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1e8,1);
          }
          if (local_238._0_1_ == true) {
            local_238 = (_Base_ptr)((ulong)local_238 & 0xffffffffffffff00);
            if ((undefined1 *)local_258._0_8_ != local_248) {
              operator_delete((void *)local_258._0_8_,local_248._0_8_ + 1);
            }
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar3);
      }
      local_248._8_8_ = local_258 + 8;
      local_258._8_4_ = 0;
      local_248._0_8_ = 0;
      local_230 = 0;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e8._M_impl.super__Rb_tree_header._M_header;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar12 = (local_220->Requires).
                super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar3 = (local_220->Requires).
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_238 = (_Base_ptr)local_248._8_8_;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pcVar12 != pcVar3) {
        pmVar4 = &local_218->Usage;
        do {
          CxxModuleLocations::BmiGeneratorPathForModule
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           *)local_210)->_M_value,loc,&pcVar12->LogicalName);
          if (local_1f0 == '\x01') {
            LVar1 = pcVar12->Method;
            if (LVar1 == ByName) {
              lVar11 = 10;
              pcVar13 = "-reference";
            }
            else if (LVar1 == IncludeQuote) {
              lVar11 = 0x11;
              pcVar13 = "-headerUnit:quote";
            }
            else {
              if (LVar1 != IncludeAngle) goto LAB_00377170;
              lVar11 = 0x11;
              pcVar13 = "-headerUnit:angle";
            }
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,pcVar13,lVar11);
            local_259 = ' ';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_259,1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(pcVar12->LogicalName)._M_dataplus._M_p,
                                (pcVar12->LogicalName)._M_string_length);
            local_259 = '=';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_259,1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)CONCAT71(local_210._1_7_,local_210[0]),
                                local_210._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_258,&pcVar12->LogicalName);
            cVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)local_218,&pcVar12->LogicalName);
            if ((_Rb_tree_header *)cVar7._M_node != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_1e8,cVar7._M_node[2]._M_right,
                         (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )&cVar7._M_node[2]._M_parent);
            }
          }
          if (local_1f0 == '\x01') {
            local_1f0 = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_210._1_7_,local_210[0]) !=
                &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_210)->_M_value).field_2) {
              operator_delete((undefined1 *)CONCAT71(local_210._1_7_,local_210[0]),
                              local_210._16_8_ + 1);
            }
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar3);
      }
      if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_1e8._M_impl.super__Rb_tree_header) {
        this = &local_218->Reference;
        pmVar5 = &local_218->Reference;
        p_Var10 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_258,(key_type *)(p_Var10 + 1));
          if (cVar8._M_node == (_Base_ptr)(local_258 + 8)) {
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                    ::find(&this->_M_t,(key_type *)(p_Var10 + 1));
            if ((_Rb_tree_header *)cVar9._M_node != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header) {
              _Var2 = cVar9._M_node[3]._M_color;
              if (_Var2 == _S_red) {
                lVar11 = 10;
                pcVar13 = "-reference";
              }
              else if (_Var2 == 2) {
                lVar11 = 0x11;
                pcVar13 = "-headerUnit:quote";
              }
              else {
                if (_Var2 != _S_black) {
LAB_00377170:
                  __assert_fail("false && \"unsupported lookup method\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCxxModuleMapper.cxx"
                                ,0x53,
                                "auto (anonymous namespace)::CxxModuleMapContentMsvc(const CxxModuleLocations &, const cmScanDepInfo &, const CxxModuleUsage &)::(anonymous class)::operator()(LookupMethod) const"
                               );
                }
                lVar11 = 0x11;
                pcVar13 = "-headerUnit:angle";
              }
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,pcVar13,lVar11);
              local_210[0] = 0x20;
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,(char *)local_210,1);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
              local_210[0] = 0x3d;
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,(char *)local_210,1);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,*(char **)(cVar9._M_node + 2),
                                  (long)cVar9._M_node[2]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            }
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_1e8._M_impl.super__Rb_tree_header);
      }
      std::__cxx11::stringbuf::str();
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_258);
    }
    else {
      (local_228->_M_dataplus)._M_p = (pointer)&local_228->field_2;
      local_228->_M_string_length = 0;
      (local_228->field_2)._M_local_buf[0] = '\0';
    }
  }
  else {
    if (format != Gcc) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCxxModuleMapper.cxx"
                    ,0x132,
                    "std::string CxxModuleMapContent(CxxModuleMapFormat, const CxxModuleLocations &, const cmScanDepInfo &, const CxxModuleUsage &)"
                   );
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"$root ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(loc->RootDirectory)._M_dataplus._M_p,
                        (loc->RootDirectory)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    pcVar12 = (obj->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (obj->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_220 = obj;
    if (pcVar12 != pcVar3) {
      do {
        CxxModuleLocations::BmiGeneratorPathForModule
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_258,loc,&pcVar12->LogicalName);
        if (local_238._0_1_ == true) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pcVar12->LogicalName)._M_dataplus._M_p,
                              (pcVar12->LogicalName)._M_string_length);
          local_1e8._M_impl._0_1_ =
               (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                )0x20;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1e8,1);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_258._0_8_,
                              CONCAT44(local_258._12_4_,local_258._8_4_));
          local_1e8._M_impl._0_1_ =
               (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                )0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1e8,1);
        }
        if (local_238._0_1_ == true) {
          local_238 = (_Base_ptr)((ulong)local_238 & 0xffffffffffffff00);
          if ((undefined1 *)local_258._0_8_ != local_248) {
            operator_delete((void *)local_258._0_8_,local_248._0_8_ + 1);
          }
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 != pcVar3);
    }
    pcVar12 = (local_220->Requires).
              super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar3 = (local_220->Requires).
             super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar12 != pcVar3) {
      do {
        CxxModuleLocations::BmiGeneratorPathForModule
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_258,loc,&pcVar12->LogicalName);
        if (local_238._0_1_ == true) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pcVar12->LogicalName)._M_dataplus._M_p,
                              (pcVar12->LogicalName)._M_string_length);
          local_1e8._M_impl._0_1_ =
               (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                )0x20;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1e8,1);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_258._0_8_,
                              CONCAT44(local_258._12_4_,local_258._8_4_));
          local_1e8._M_impl._0_1_ =
               (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                )0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1e8,1);
        }
        if (local_238._0_1_ == true) {
          local_238 = (_Base_ptr)((ulong)local_238 & 0xffffffffffffff00);
          if ((undefined1 *)local_258._0_8_ != local_248) {
            operator_delete((void *)local_258._0_8_,local_248._0_8_ + 1);
          }
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 != pcVar3);
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_228;
}

Assistant:

std::string CxxModuleMapContent(CxxModuleMapFormat format,
                                CxxModuleLocations const& loc,
                                cmScanDepInfo const& obj,
                                CxxModuleUsage const& usages)
{
  switch (format) {
    case CxxModuleMapFormat::Gcc:
      return CxxModuleMapContentGcc(loc, obj);
    case CxxModuleMapFormat::Msvc:
      return CxxModuleMapContentMsvc(loc, obj, usages);
  }

  assert(false);
  return {};
}